

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_dse_ustore(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  IRRef1 IVar3;
  short sVar4;
  short sVar5;
  TRef TVar6;
  IRRef1 *pIVar7;
  ulong uVar8;
  ushort uVar9;
  IRIns *pIVar10;
  IRRef1 *pIVar11;
  ulong uVar12;
  
  uVar2 = (J->fold).ins.field_0.op1;
  uVar8 = (ulong)uVar2;
  uVar9 = J->chain[0x49];
  if (uVar2 < uVar9) {
    IVar3 = (J->fold).ins.field_0.op2;
    pIVar10 = (J->cur).ir;
    pIVar11 = J->chain + 0x49;
    do {
      pIVar1 = pIVar10 + uVar9;
      uVar12 = (ulong)(pIVar1->field_0).op1;
      if (*(char *)((long)pIVar10 + uVar8 * 8 + 5) == *(char *)((long)pIVar10 + uVar12 * 8 + 5)) {
        sVar4 = *(short *)((long)pIVar10 + uVar8 * 8 + 2);
        sVar5 = *(short *)((long)pIVar10 + uVar12 * 8 + 2);
        if (pIVar10[uVar8].field_0.op1 == pIVar10[uVar12].field_0.op1) {
          if (sVar4 == sVar5) {
            if ((pIVar1->field_0).op2 == IVar3) {
              return 4;
            }
            if (J->chain[0x11] < uVar9) {
              uVar8 = (ulong)((J->cur).nins - 1);
              if (uVar8 <= uVar9) goto LAB_0012d438;
              pIVar10 = pIVar10 + uVar8;
              goto LAB_0012d428;
            }
            break;
          }
        }
        else if (((char)sVar5 == (char)sVar4) && ((pIVar1->field_0).op2 != IVar3)) break;
      }
      uVar9 = (pIVar1->field_0).prev;
      pIVar11 = &(pIVar1->field_0).prev;
    } while (uVar2 < uVar9);
  }
  goto LAB_0012d3f1;
  while (pIVar10 = pIVar10 + -1, pIVar1 < pIVar10) {
LAB_0012d428:
    if ((char)(pIVar10->field_1).t.irt < '\0') goto LAB_0012d3f1;
  }
LAB_0012d438:
  *pIVar11 = (pIVar1->field_0).prev;
  *pIVar1 = (IRIns)0xc0000000000;
  if (((uVar9 + 1 < (J->cur).nins) && (*(char *)((long)pIVar1 + 0xd) == 'S')) &&
     (pIVar1[1].field_0.op1 == uVar2)) {
    pIVar10 = (J->cur).ir;
    pIVar11 = J->chain + 0x53;
    do {
      pIVar7 = pIVar11;
      uVar2 = *pIVar7;
      pIVar11 = &(&pIVar10->field_0)[uVar2].prev;
    } while (uVar9 + 1 < (uint)uVar2);
    pIVar10 = pIVar10 + uVar2;
    *pIVar7 = (pIVar10->field_0).prev;
    *pIVar10 = (IRIns)0xc0000000000;
  }
LAB_0012d3f1:
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	store->o = IR_NOP;
	store->t.irt = IRT_NIL;
	store->op1 = store->op2 = 0;
	store->prev = 0;
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  obar->o = IR_NOP;
	  obar->t.irt = IRT_NIL;
	  obar->op1 = obar->op2 = 0;
	  obar->prev = 0;
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}